

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O3

void __thiscall RigidBodyDynamics::Errors::RBDLError::RBDLError(RBDLError *this,string *text)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__RBDLError_0019b928;
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  pcVar1 = (text->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->text,pcVar1,pcVar1 + text->_M_string_length);
  return;
}

Assistant:

RBDLError::RBDLError(std::string text): text(text) {}